

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O2

void cmCMakePresetsErrors::TOOLCHAIN_FILE_UNSUPPORTED(cmJSONState *state)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"File version must be 3 or higher for toolchainFile preset support"
             ,&local_31);
  cmJSONState::AddError(state,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void TOOLCHAIN_FILE_UNSUPPORTED(cmJSONState* state)
{
  state->AddError("File version must be 3 or higher for toolchainFile preset "
                  "support");
}